

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseConnection.cpp
# Opt level: O1

void __thiscall tonk::Connection::~Connection(Connection *this)

{
  strand *psVar1;
  HostnameResolverState *__ptr;
  pointer pcVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  
  (this->super_IConnection)._vptr_IConnection = (_func_int **)&PTR__Connection_001d3ac0;
  (this->super_IIncomingHandler)._vptr_IIncomingHandler = (_func_int **)&PTR__Connection_001d3b00;
  LOCK();
  ActiveConnectionCount = ActiveConnectionCount + -1;
  UNLOCK();
  psVar1 = (this->AsioEventStrand)._M_t.
           super___uniq_ptr_impl<asio::io_context::strand,_std::default_delete<asio::io_context::strand>_>
           ._M_t.
           super__Tuple_impl<0UL,_asio::io_context::strand_*,_std::default_delete<asio::io_context::strand>_>
           .super__Head_base<0UL,_asio::io_context::strand_*,_false>._M_head_impl;
  if (psVar1 != (strand *)0x0) {
    operator_delete(psVar1);
  }
  (this->AsioEventStrand)._M_t.
  super___uniq_ptr_impl<asio::io_context::strand,_std::default_delete<asio::io_context::strand>_>.
  _M_t.
  super__Tuple_impl<0UL,_asio::io_context::strand_*,_std::default_delete<asio::io_context::strand>_>
  .super__Head_base<0UL,_asio::io_context::strand_*,_false>._M_head_impl = (strand *)0x0;
  std::
  unique_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>,_std::default_delete<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::waitable_timer_service<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>_>_>
  ::~unique_ptr(&this->Ticker);
  std::unique_ptr<tonk::NATHolePuncher,_std::default_delete<tonk::NATHolePuncher>_>::~unique_ptr
            (&this->HolePuncher);
  __ptr = (this->ResolverState)._M_t.
          super___uniq_ptr_impl<tonk::HostnameResolverState,_std::default_delete<tonk::HostnameResolverState>_>
          ._M_t.
          super__Tuple_impl<0UL,_tonk::HostnameResolverState_*,_std::default_delete<tonk::HostnameResolverState>_>
          .super__Head_base<0UL,_tonk::HostnameResolverState_*,_false>._M_head_impl;
  if (__ptr != (HostnameResolverState *)0x0) {
    std::default_delete<tonk::HostnameResolverState>::operator()
              ((default_delete<tonk::HostnameResolverState> *)&this->ResolverState,__ptr);
  }
  (this->ResolverState)._M_t.
  super___uniq_ptr_impl<tonk::HostnameResolverState,_std::default_delete<tonk::HostnameResolverState>_>
  ._M_t.
  super__Tuple_impl<0UL,_tonk::HostnameResolverState_*,_std::default_delete<tonk::HostnameResolverState>_>
  .super__Head_base<0UL,_tonk::HostnameResolverState_*,_false>._M_head_impl =
       (HostnameResolverState *)0x0;
  MessageDecompressor::~MessageDecompressor(&(this->Incoming).Decompressor);
  (this->Outgoing).super_IIncomingToOutgoing._vptr_IIncomingToOutgoing =
       (_func_int **)&PTR__SessionOutgoing_001d4248;
  MessageCompressor::~MessageCompressor(&(this->Outgoing).Compressor);
  pktalloc::Allocator::~Allocator
            (&(this->Outgoing).super_OutgoingQueueCommon.WriteAllocator.Allocator);
  pcVar2 = (this->Logger).Prefix._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != &(this->Logger).Prefix.field_2) {
    operator_delete(pcVar2);
  }
  this_00 = (this->Deps).Context.super___shared_ptr<asio::io_context,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  (this->super_IConnection)._vptr_IConnection = (_func_int **)&PTR__IConnection_001d3bd8;
  pcVar2 = (this->super_IConnection).SelfRefCount.ShutdownJson._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != &(this->super_IConnection).SelfRefCount.ShutdownJson.field_2) {
    operator_delete(pcVar2);
    return;
  }
  return;
}

Assistant:

Connection::~Connection()
{
    ActiveConnectionCount--;
}